

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec2 __thiscall djb::microfacet::s2_to_u2(microfacet *this,vec3 *wo,vec3 *wi,void *user_args)

{
  long lVar1;
  args *this_00;
  vec2 vVar2;
  vec3 local_70;
  args args;
  
  if (wi->z < 0.0) {
    __assert_fail("wi.z >= 0 && \"invalid incident direction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x5cf,
                  "virtual vec2 djb::microfacet::s2_to_u2(const vec3 &, const vec3 &, const void *) const"
                 );
  }
  if (user_args == (void *)0x0) {
    this_00 = &args;
    microfacet::args::standard();
  }
  else {
    this_00 = &args;
    for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
      (this_00->mtra).r[0].x = *user_args;
      user_args = (float_t *)((long)user_args + 4);
      this_00 = (args *)&(this_00->mtra).r[0].y;
    }
  }
  local_70 = s2_to_h2((microfacet *)this_00,wo,wi);
  vVar2 = h2_to_u2(this,&local_70,wi,&args);
  return vVar2;
}

Assistant:

vec2
microfacet::s2_to_u2(
	const vec3 &wo, const vec3 &wi, const void *user_args
) const {
	DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_u2(s2_to_h2(wo, wi), wi, args);
}